

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsappcurses.h
# Opt level: O1

void __thiscall
FrobTadsApplicationCurses::print
          (FrobTadsApplicationCurses *this,int line,int column,int attrs,char *str)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  
  lVar2 = 0;
  bVar3 = *str;
  while (bVar3 != 0) {
    (this->fDispBuf)._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
    _M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar2] = (uint)bVar3 | attrs;
    lVar1 = lVar2 + 1;
    lVar2 = lVar2 + 1;
    bVar3 = str[lVar1];
  }
  (this->fDispBuf)._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar2] = 0;
  FrobTadsWindow::printStr
            ((this->fGameWindow)._M_t.
             super___uniq_ptr_impl<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>._M_t.
             super__Tuple_impl<0UL,_FrobTadsWindow_*,_std::default_delete<FrobTadsWindow>_>.
             super__Head_base<0UL,_FrobTadsWindow_*,_false>._M_head_impl,line,column,
             (this->fDispBuf)._M_t.
             super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
             super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl);
  return;
}

Assistant:

virtual void
    print( int line, int column, int attrs, const char* str )
    {
        int i;
        for (i = 0; str[i] != '\0'; ++i)
            this->fDispBuf[i] = static_cast<unsigned char>(str[i]) | attrs;
        this->fDispBuf[i] = '\0';
        this->fGameWindow->printStr(line, column, this->fDispBuf.get());
    }